

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pivotref.cpp
# Opt level: O1

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::PivotRef::Copy(PivotRef *this)

{
  bool bVar1;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var2;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar3;
  PivotColumn *pPVar4;
  undefined8 uVar5;
  pointer pTVar6;
  pointer pPVar7;
  pointer pPVar8;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *aggr;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_00
  ;
  pointer *__ptr;
  long in_RSI;
  PivotColumn *this_01;
  templated_unique_single_t copy;
  __uniq_ptr_impl<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>_> local_b8;
  long local_b0;
  __uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_> local_a8;
  undefined1 local_a0 [48];
  vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_> local_70;
  _Alloc_hider local_58;
  char local_48 [16];
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_38;
  
  local_a8._M_t.super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
       (tuple<duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)
       (tuple<duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)this;
  local_b8._M_t.super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
  super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl =
       (tuple<duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>)operator_new(0x120);
  *(undefined1 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 8) = 9;
  *(undefined8 **)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x10) =
       (undefined8 *)
       ((long)local_b8._M_t.
              super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
              super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x20);
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined1 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x38) = 0xffffffffffffffff
  ;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x40) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x50) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x58) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x60) = 0;
  *(undefined ***)
   local_b8._M_t.super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
   super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl = &PTR__PivotRef_0247edc0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x68) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x70) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x78) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x80) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x88) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x90) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x98) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0xa0) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0xa8) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0xb0) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0xb8) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0xc0) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0xc1) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0xc9) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x118) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x108) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x110) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0xf8) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0x100) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0xe8) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0xf0) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0xd8) = 0;
  *(undefined8 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
          super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl + 0xe0) = 0;
  local_b0 = in_RSI;
  pTVar6 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                     ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                      (in_RSI + 0x68));
  (*pTVar6->_vptr_TableRef[4])(local_a0,pTVar6);
  pPVar7 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                     ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true> *)
                      &local_b8);
  uVar5 = local_a0._0_8_;
  local_a0._0_8_ = (ParsedExpression *)0x0;
  _Var2._M_head_impl =
       (pPVar7->source).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
       _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pPVar7->source).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)uVar5;
  if (_Var2._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableRef + 8))();
  }
  if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
      local_a0._0_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_a0._0_8_ + 8))();
  }
  this_00 = *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              **)(local_b0 + 0x70);
  puVar3 = *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             **)(local_b0 + 0x78);
  if (this_00 != puVar3) {
    do {
      pPVar7 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                         ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                           *)&local_b8);
      pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this_00);
      (*(pPVar8->super_BaseExpression)._vptr_BaseExpression[0xc])
                ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_a0,pPVar8);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pPVar7->aggregates,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_a0);
      if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)local_a0._0_8_ !=
          (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
        (*((BaseExpression *)local_a0._0_8_)->_vptr_BaseExpression[1])();
      }
      this_00 = this_00 + 1;
    } while (this_00 != puVar3);
  }
  pPVar7 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                     ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true> *)
                      &local_b8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pPVar7->unpivot_names,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_b0 + 0x88));
  this_01 = *(PivotColumn **)(local_b0 + 0xa0);
  pPVar4 = *(PivotColumn **)(local_b0 + 0xa8);
  if (this_01 != pPVar4) {
    do {
      pPVar7 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                         ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                           *)&local_b8);
      PivotColumn::Copy((PivotColumn *)local_a0,this_01);
      ::std::vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>::
      emplace_back<duckdb::PivotColumn>
                (&(pPVar7->pivots).
                  super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>,
                 (PivotColumn *)local_a0);
      if ((_Head_base<0UL,_duckdb::QueryNode_*,_false>)local_38._M_head_impl !=
          (_Head_base<0UL,_duckdb::QueryNode_*,_false>)0x0) {
        (*(local_38._M_head_impl)->_vptr_QueryNode[1])();
      }
      local_38._M_head_impl = (QueryNode *)0x0;
      if (local_58._M_p != local_48) {
        operator_delete(local_58._M_p);
      }
      ::std::vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>::~vector
                (&local_70);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_a0 + 0x18));
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)local_a0);
      this_01 = this_01 + 1;
    } while (this_01 != pPVar4);
  }
  pPVar7 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                     ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true> *)
                      &local_b8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pPVar7->groups,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_b0 + 0xb8));
  pPVar7 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                     ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true> *)
                      &local_b8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(pPVar7->super_TableRef).column_name_alias,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_b0 + 0x50));
  bVar1 = *(bool *)(local_b0 + 0xd0);
  pPVar7 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                     ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true> *)
                      &local_b8);
  pPVar7->include_nulls = bVar1;
  pPVar7 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                     ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true> *)
                      &local_b8);
  ::std::__cxx11::string::_M_assign((string *)&(pPVar7->super_TableRef).alias);
  *(tuple<duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_> *)
   local_a8._M_t.super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
   super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
       local_b8._M_t.
       super__Tuple_impl<0UL,_duckdb::PivotRef_*,_std::default_delete<duckdb::PivotRef>_>.
       super__Head_base<0UL,_duckdb::PivotRef_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)
         local_a8._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<TableRef> PivotRef::Copy() {
	auto copy = make_uniq<PivotRef>();
	copy->source = source->Copy();
	for (auto &aggr : aggregates) {
		copy->aggregates.push_back(aggr->Copy());
	}
	copy->unpivot_names = unpivot_names;
	for (auto &entry : pivots) {
		copy->pivots.push_back(entry.Copy());
	}
	copy->groups = groups;
	copy->column_name_alias = column_name_alias;
	copy->include_nulls = include_nulls;
	copy->alias = alias;
	return std::move(copy);
}